

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar * u_memchr_63(UChar *s,UChar c,int32_t count)

{
  UChar *pUVar1;
  long lVar2;
  UChar local_2;
  
  if (0 < count) {
    if ((c & 0xf800U) == 0xd800) {
      pUVar1 = u_strFindFirst_63(s,count,&local_2,1);
      return pUVar1;
    }
    lVar2 = (ulong)(uint)count * 2;
    do {
      if (*s == c) {
        return s;
      }
      s = s + 1;
      lVar2 = lVar2 + -2;
    } while (lVar2 != 0);
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memchr(const UChar *s, UChar c, int32_t count) {
    if(count<=0) {
        return NULL; /* no string */
    } else if(U16_IS_SURROGATE(c)) {
        /* make sure to not find half of a surrogate pair */
        return u_strFindFirst(s, count, &c, 1);
    } else {
        /* trivial search for a BMP code point */
        const UChar *limit=s+count;
        do {
            if(*s==c) {
                return (UChar *)s;
            }
        } while(++s!=limit);
        return NULL;
    }
}